

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVStreambuf.cxx
# Opt level: O2

int testUVStreambuf(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  
  if (argc < 2) {
    pcVar2 = "Invalid arguments.\n";
  }
  else {
    bVar1 = testUVStreambufRead(writeDataToStreamPipe,argv[1]);
    if (bVar1) {
      bVar1 = testUVStreambufRead(writeDataToStreamProcess,argv[1]);
      if (bVar1) {
        return 0;
      }
      pcVar2 = "While executing testUVStreambufRead() with process.\n";
    }
    else {
      pcVar2 = "While executing testUVStreambufRead() with pipe.\n";
    }
  }
  std::operator<<((ostream *)&std::cout,pcVar2);
  return -1;
}

Assistant:

int testUVStreambuf(int argc, char** const argv)
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  if (!testUVStreambufRead(writeDataToStreamPipe, argv[1])) {
    std::cout << "While executing testUVStreambufRead() with pipe.\n";
    return -1;
  }

  if (!testUVStreambufRead(writeDataToStreamProcess, argv[1])) {
    std::cout << "While executing testUVStreambufRead() with process.\n";
    return -1;
  }

  return 0;
}